

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_heart_Printer.h
# Opt level: O2

void soul::heart::Printer::print(Program *p,CodePrinter *out)

{
  pointer ppVar1;
  CodePrinter *pCVar2;
  pointer ppVar3;
  PrinterStream local_88;
  
  pCVar2 = choc::text::CodePrinter::operator<<(out,'#');
  pCVar2 = choc::text::CodePrinter::operator<<(pCVar2,"SOUL");
  pCVar2 = choc::text::CodePrinter::operator<<(pCVar2,' ');
  pCVar2 = choc::text::CodePrinter::operator<<(pCVar2,1);
  choc::text::CodePrinter::operator<<(pCVar2,(BlankLine *)&blankLine);
  ppVar1 = (p->pimpl->modules).
           super__Vector_base<soul::pool_ref<soul::Module>,_std::allocator<soul::pool_ref<soul::Module>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (ppVar3 = (p->pimpl->modules).
                super__Vector_base<soul::pool_ref<soul::Module>,_std::allocator<soul::pool_ref<soul::Module>_>_>
                ._M_impl.super__Vector_impl_data._M_start; ppVar3 != ppVar1; ppVar3 = ppVar3 + 1) {
    local_88.module = ppVar3->object;
    local_88.localVariableNames._M_h._M_bucket_count = 1;
    local_88.localVariableNames._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    local_88.localVariableNames._M_h._M_element_count = 0;
    local_88.localVariableNames._M_h._M_rehash_policy._M_max_load_factor = 1.0;
    local_88.allVisibleVariables.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_88.allVisibleVariables.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_88.localVariableNames._M_h._M_rehash_policy._M_next_resize = 0;
    local_88.localVariableNames._M_h._M_single_bucket = (__node_base_ptr)0x0;
    local_88.allVisibleVariables.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_88.out = out;
    local_88.localVariableNames._M_h._M_buckets = &local_88.localVariableNames._M_h._M_single_bucket
    ;
    PrinterStream::printAll(&local_88);
    PrinterStream::~PrinterStream(&local_88);
  }
  return;
}

Assistant:

static void print (const Program& p, choc::text::CodePrinter& out)
    {
        out << '#' << getHEARTFormatVersionPrefix() << ' ' << getHEARTFormatVersion() << blankLine;

        for (auto& module : p.getModules())
            PrinterStream (module, out).printAll();
    }